

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O0

void Js::CacheOperators::CachePropertyWrite
               (RecyclableObject *object,bool isRoot,Type *typeWithoutProperty,PropertyId propertyId
               ,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  PropertyIndex PVar2;
  byte bVar3;
  bool bVar4;
  InlineCacheFlags IVar5;
  PropertyIndex PVar6;
  uint16 uVar7;
  uint uVar8;
  uint uVar9;
  TypeId typeId;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 *puVar13;
  DynamicObject *pDVar14;
  RootObjectBase *this;
  DynamicType *pDVar15;
  DynamicTypeHandler *pDVar16;
  DynamicType *this_00;
  DynamicTypeHandler *this_01;
  Type *pTVar17;
  ScriptContext *pSVar18;
  int local_c8;
  bool isProto;
  int newInlineCapacity;
  int newCapacity;
  int oldCapacity;
  DynamicTypeHandler *newTypeHandler;
  DynamicTypeHandler *oldTypeHandler;
  int requiredAuxSlotCapacity;
  DynamicType *oldType;
  DynamicType *newType;
  bool isInlineSlot;
  DynamicObject *pDStack_60;
  PropertyIndex slotIndex;
  DynamicObject *dynamicInstance;
  RecyclableObject *instance;
  PropertyIndex propertyIndex;
  ScriptContext *pSStack_48;
  BOOL isSetter;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  DynamicType *pDStack_30;
  PropertyId propertyId_local;
  Type *typeWithoutProperty_local;
  DynamicObject *pDStack_20;
  bool isRoot_local;
  RecyclableObject *object_local;
  
  pSStack_48 = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local._4_4_ = propertyId;
  pDStack_30 = (DynamicType *)typeWithoutProperty;
  typeWithoutProperty_local._7_1_ = isRoot;
  pDStack_20 = (DynamicObject *)object;
  if (typeWithoutProperty == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xa5,"(typeWithoutProperty != nullptr)",
                                "typeWithoutProperty != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  bVar4 = CanCachePropertyWrite
                    ((PropertyValueInfo *)requestContext_local,&pDStack_20->super_RecyclableObject,
                     pSStack_48);
  if (!bVar4) {
    return;
  }
  IVar5 = PropertyValueInfo::GetFlags((PropertyValueInfo *)requestContext_local);
  instance._4_4_ = (uint)(IVar5 == InlineCacheSetterFlag);
  pDVar14 = (DynamicObject *)
            PropertyValueInfo::GetInstance((PropertyValueInfo *)requestContext_local);
  if ((pDVar14 != pDStack_20) && (instance._4_4_ == 0)) {
    bVar4 = PropertyValueInfo::IsNoCache((PropertyValueInfo *)requestContext_local);
    if (bVar4) {
      return;
    }
    uVar8 = (*(pDStack_20->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                      (pDStack_20,(ulong)info_local._4_4_);
    if ((uVar8 & 0xffff) == 0xffff) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xb2,
                                "(info->IsNoCache() || object->GetPropertyIndex(propertyId) == Constants::NoSlot)"
                                ,"Missed updating PropertyValueInfo?");
    if (bVar4) {
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  instance._2_2_ = PropertyValueInfo::GetPropertyIndex((PropertyValueInfo *)requestContext_local);
  if (instance._4_4_ == 0) {
    if (instance._2_2_ == 0xffff) {
      return;
    }
  }
  else if ((instance._2_2_ & 0xf000) != 0) {
    return;
  }
  if ((((typeWithoutProperty_local._7_1_ & 1) != 0) ||
      (uVar8 = (uint)instance._2_2_,
      uVar9 = (*(pDStack_20->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                        (pDStack_20,(ulong)info_local._4_4_), uVar8 != (uVar9 & 0xffff))) &&
     (PVar2 = instance._2_2_, instance._4_4_ == 0)) {
    if ((typeWithoutProperty_local._7_1_ & 1) != 0) {
      this = VarTo<Js::RootObjectBase,Js::RecyclableObject>(&pDStack_20->super_RecyclableObject);
      PVar6 = RootObjectBase::GetRootPropertyIndex(this,info_local._4_4_);
      if (PVar2 == PVar6) goto LAB_00d9c502;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,200,
                                "((!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter || (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId)))"
                                ,
                                "(!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter || (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId))"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
LAB_00d9c502:
  typeId = RecyclableObject::GetTypeId(&pDStack_20->super_RecyclableObject);
  bVar4 = DynamicType::Is(typeId);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xc9,"(DynamicType::Is(object->GetTypeId()))",
                                "DynamicType::Is(object->GetTypeId())");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  IVar5 = PropertyValueInfo::GetFlags((PropertyValueInfo *)requestContext_local);
  if ((IVar5 & InlineCacheGetterFlag) != InlineCacheNoFlags) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xca,"((info->GetFlags() & InlineCacheGetterFlag) == 0)",
                                "invalid getter for CachePropertyWrite");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  dynamicInstance =
       (DynamicObject *)PropertyValueInfo::GetInstance((PropertyValueInfo *)requestContext_local);
  pDStack_60 = VarTo<Js::DynamicObject,Js::RecyclableObject>((RecyclableObject *)dynamicInstance);
  pDVar15 = DynamicObject::GetDynamicType(pDStack_60);
  pDVar16 = DynamicType::GetTypeHandler(pDVar15);
  DynamicTypeHandler::PropertyIndexToInlineOrAuxSlotIndex
            (pDVar16,instance._2_2_,(PropertyIndex *)((long)&newType + 6),
             (bool *)((long)&newType + 5));
  if (instance._4_4_ != 0) {
    bVar4 = dynamicInstance != pDStack_20;
    if ((bVar4) &&
       (pSVar18 = RecyclableObject::GetScriptContext(&dynamicInstance->super_RecyclableObject),
       pSVar18 != pSStack_48)) {
      return;
    }
    pDVar14 = pDStack_60;
    pTVar17 = RecyclableObject::GetType(&pDStack_20->super_RecyclableObject);
    Cache<true,false,false>
              (bVar4,pDVar14,false,pTVar17,(Type *)0x0,info_local._4_4_,newType._6_2_,
               (bool)(newType._5_1_ & 1),false,0,(PropertyValueInfo *)requestContext_local,
               pSStack_48);
    return;
  }
  if (dynamicInstance != pDStack_20) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xd4,"(instance == object)","invalid instance for non setter");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  bVar4 = DynamicType::Is(&pDStack_30->super_Type);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xd5,"(DynamicType::Is(typeWithoutProperty))",
                                "DynamicType::Is(typeWithoutProperty)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  bVar4 = PropertyValueInfo::IsNoCache((PropertyValueInfo *)requestContext_local);
  if (((!bVar4) &&
      (bVar4 = PropertyValueInfo::IsStoreFieldCacheEnabled
                         ((PropertyValueInfo *)requestContext_local), bVar4)) &&
     (uVar8 = (*(pDStack_20->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x48])
                        (pDStack_20,(ulong)info_local._4_4_,
                         (ulong)typeWithoutProperty_local._7_1_ & 1), (uVar8 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xd7,
                                "(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot))"
                                ,
                                "info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot)"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  bVar4 = PropertyValueInfo::IsWritable((PropertyValueInfo *)requestContext_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xd9,"(info->IsWritable())","info->IsWritable()");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  this_00 = (DynamicType *)RecyclableObject::GetType(&pDStack_20->super_RecyclableObject);
  pDVar15 = pDStack_30;
  if (this_00 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xde,"(newType)","newType");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  if ((this_00 != pDVar15) && (bVar4 = DynamicType::GetIsShared(this_00), bVar4)) {
    pDVar16 = DynamicType::GetTypeHandler(this_00);
    iVar10 = (*pDVar16->_vptr_DynamicTypeHandler[0x4e])();
    if (iVar10 != 0) {
      pDVar16 = DynamicType::GetTypeHandler(pDVar15);
      bVar4 = DynamicTypeHandler::GetIsPrototype(pDVar16);
      if (!bVar4) {
        pDVar16 = DynamicType::GetTypeHandler(pDVar15);
        this_01 = DynamicType::GetTypeHandler(this_00);
        iVar10 = (*pDVar16->_vptr_DynamicTypeHandler[0x4e])();
        if (iVar10 == 0) {
          return;
        }
        iVar10 = DynamicTypeHandler::GetSlotCapacity(pDVar16);
        local_c8 = DynamicTypeHandler::GetSlotCapacity(this_01);
        uVar7 = DynamicTypeHandler::GetInlineSlotCapacity(this_01);
        uVar8 = (uint)uVar7;
        iVar11 = (*pDVar16->_vptr_DynamicTypeHandler[6])();
        iVar12 = (*this_01->_vptr_DynamicTypeHandler[6])();
        if (iVar11 + 1 != iVar12) {
          iVar11 = (*pDVar16->_vptr_DynamicTypeHandler[6])();
          iVar12 = (*this_01->_vptr_DynamicTypeHandler[6])();
          if (iVar11 != iVar12) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                        ,0xf7,
                                        "(((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() + 1 == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount() || ((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount())"
                                        ,
                                        "Don\'t cache type transitions that add multiple properties."
                                       );
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
        }
        bVar4 = DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(pDVar16,this_01);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                      ,0xfb,
                                      "(DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(oldTypeHandler, newTypeHandler))"
                                      ,"TypeHandler should be compatible for transition.");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        if ((((newType._5_1_ & 1) != 0) && (iVar10 != local_c8)) && ((int)uVar8 < local_c8)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                      ,0xfe,
                                      "(!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity)"
                                      ,
                                      "!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity"
                                     );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        if (((newType._5_1_ & 1) == 0) && (local_c8 <= (int)uVar8)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                      ,0x100,"(isInlineSlot || newCapacity > newInlineCapacity)",
                                      "isInlineSlot || newCapacity > newInlineCapacity");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        if ((((newType._5_1_ & 1) == 0) && (iVar10 != local_c8)) &&
           (uVar9 = (uint)newType._6_2_, uVar7 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar16),
           uVar9 != iVar10 - (uint)uVar7)) {
          bVar4 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(pDVar16);
          if (bVar4) {
            uVar7 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar16);
            PVar6 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
            PVar2 = newType._6_2_;
            if ((uVar8 == (uint)uVar7 - (uint)PVar6) &&
               (PVar6 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity(), PVar2 == PVar6))
            goto LAB_00d9cd4b;
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                      ,0x10f,
                                      "(isInlineSlot || oldCapacity == newCapacity || slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() || ( oldTypeHandler->IsObjectHeaderInlinedTypeHandler() && newInlineCapacity == oldTypeHandler->GetInlineSlotCapacity() - DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() && slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() ))"
                                      ,
                                      "isInlineSlot || oldCapacity == newCapacity || slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() || ( oldTypeHandler->IsObjectHeaderInlinedTypeHandler() && newInlineCapacity == oldTypeHandler->GetInlineSlotCapacity() - DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() && slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() )"
                                     );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
LAB_00d9cd4b:
        if (((newType._5_1_ & 1) == 0) && (iVar10 < local_c8)) {
          local_c8 = local_c8 - uVar8;
        }
        else {
          local_c8 = 0;
        }
        oldTypeHandler._4_4_ = local_c8;
        if (0x7fff < local_c8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                      ,0x114,
                                      "(requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount))"
                                      ,
                                      "requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount)"
                                     );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        goto LAB_00d9ce0f;
      }
    }
  }
  pDStack_30 = (DynamicType *)0x0;
  oldTypeHandler._4_4_ = 0;
LAB_00d9ce0f:
  pDVar14 = VarTo<Js::DynamicObject,Js::RecyclableObject>(&pDStack_20->super_RecyclableObject);
  bVar3 = typeWithoutProperty_local._7_1_;
  pTVar17 = RecyclableObject::GetType(&pDStack_20->super_RecyclableObject);
  Cache<false,false,true>
            (false,pDVar14,(bool)(bVar3 & 1),pTVar17,&pDStack_30->super_Type,info_local._4_4_,
             newType._6_2_,(bool)(newType._5_1_ & 1),false,oldTypeHandler._4_4_,
             (PropertyValueInfo *)requestContext_local,pSStack_48);
  return;
}

Assistant:

void CacheOperators::CachePropertyWrite(
        RecyclableObject * object,
        const bool isRoot,
        Type* typeWithoutProperty,
        PropertyId propertyId,
        PropertyValueInfo* info,
        ScriptContext * requestContext)
    {
        Assert(typeWithoutProperty != nullptr);

        if (!CacheOperators::CanCachePropertyWrite(info, object, requestContext))
        {
            return;
        }

        BOOL isSetter = (info->GetFlags() == InlineCacheSetterFlag);

        if (info->GetInstance() != object) // We can't cache if slot owner is not the object
        {
            if (!isSetter)
            {
                AssertMsg(info->IsNoCache() || object->GetPropertyIndex(propertyId) == Constants::NoSlot, "Missed updating PropertyValueInfo?");
                return;
            }
        }

        PropertyIndex propertyIndex = info->GetPropertyIndex();
        if (isSetter)
        {
            if (propertyIndex & 0xf000)
            {
                return;
            }
        }
        else
        {
            if (propertyIndex == Constants::NoSlot)
            {
                return;
            }
        }

        Assert((!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter ||
            (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId)));
        Assert(DynamicType::Is(object->GetTypeId()));
        AssertMsg((info->GetFlags() & InlineCacheGetterFlag) == 0, "invalid getter for CachePropertyWrite");

        RecyclableObject* instance = info->GetInstance();
        DynamicObject * dynamicInstance = VarTo<DynamicObject>(instance);
        PropertyIndex slotIndex;
        bool isInlineSlot;
        dynamicInstance->GetDynamicType()->GetTypeHandler()->PropertyIndexToInlineOrAuxSlotIndex(propertyIndex, &slotIndex, &isInlineSlot);

        if (!isSetter)
        {
            AssertMsg(instance == object, "invalid instance for non setter");
            Assert(DynamicType::Is(typeWithoutProperty));
#if ENABLE_FIXED_FIELDS
            Assert(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot));
#endif
            Assert(info->IsWritable());

            DynamicType* newType = (DynamicType*)object->GetType();
            DynamicType* oldType = (DynamicType*)typeWithoutProperty;

            Assert(newType);

            int requiredAuxSlotCapacity;
            // Don't cache property adds for types that aren't (yet) shared.  We must go down the slow path to force type sharing
            // and invalidate any potential fixed fields this type may have.
            // Don't cache property adds to prototypes, so we don't have to check if the object is a prototype on the fast path.
            if (newType != oldType && newType->GetIsShared() && newType->GetTypeHandler()->IsPathTypeHandler() && (!oldType->GetTypeHandler()->GetIsPrototype()))
            {
                DynamicTypeHandler* oldTypeHandler = oldType->GetTypeHandler();
                DynamicTypeHandler* newTypeHandler = newType->GetTypeHandler();

                // This may be the transition from deferred type handler to path type handler. Don't try to cache now.
                if (!oldTypeHandler->IsPathTypeHandler())
                {
                    return;
                }

                int oldCapacity = oldTypeHandler->GetSlotCapacity();
                int newCapacity = newTypeHandler->GetSlotCapacity();
                int newInlineCapacity = newTypeHandler->GetInlineSlotCapacity();

                // We are adding only one property here.  If some other properties were added as a side effect on the slow path
                // we should never cache the type transition, as the other property slots will not be populated by the fast path.
                AssertMsg(((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() + 1 == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount() ||
                          ((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount(),
                    "Don't cache type transitions that add multiple properties.");

                // InlineCache::TrySetProperty assumes the following invariants to decide if and how to adjust auxiliary slot capacity.
                AssertMsg(DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(oldTypeHandler, newTypeHandler),
                    "TypeHandler should be compatible for transition.");

                // If the slot is inlined then we should never need to adjust auxiliary slot capacity.
                Assert(!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity);
                // If the slot is not inlined then the new type must have some auxiliary slots.
                Assert(isInlineSlot || newCapacity > newInlineCapacity);

                // If the slot is not inlined and the property being added exceeds the old type's slot capacity, then slotIndex corresponds
                // to the number of occupied auxiliary slots (i.e. the old type's auxiliary slot capacity).
                // If the object is optimized for <=2 properties, then slotIndex should be same as the oldCapacity(as there is no inlineSlots in the new typeHandler).
                Assert(
                    isInlineSlot ||
                    oldCapacity == newCapacity ||
                    slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() ||
                    (
                        oldTypeHandler->IsObjectHeaderInlinedTypeHandler() &&
                        newInlineCapacity ==
                            oldTypeHandler->GetInlineSlotCapacity() -
                            DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() &&
                        slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
                    ));

                requiredAuxSlotCapacity = (!isInlineSlot && oldCapacity < newCapacity) ? newCapacity - newInlineCapacity : 0;

                // Required auxiliary slot capacity must fit in the available inline cache bits.
                Assert(requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount));
            }
            else
            {
                typeWithoutProperty = nullptr;
                requiredAuxSlotCapacity = 0;
            }

            Cache<false, false, true>(
                false,
                VarTo<DynamicObject>(object),
                isRoot,
                object->GetType(),
                typeWithoutProperty,
                propertyId,
                slotIndex,
                isInlineSlot,
                false,
                requiredAuxSlotCapacity,
                info,
                requestContext);
            return;
        }

        const bool isProto = instance != object;
        if(isProto && instance->GetScriptContext() != requestContext)
        {
            // Don't cache if object and prototype are from different context
            return;
        }

        Cache<true, false, false>(
            isProto,
            dynamicInstance,
            false,
            object->GetType(),
            nullptr,
            propertyId,
            slotIndex,
            isInlineSlot,
            false,
            0,
            info,
            requestContext);
    }